

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeoutMonitor.cpp
# Opt level: O2

void __thiscall helics::TimeoutMonitor::pingSub(TimeoutMonitor *this,CoreBroker *brk)

{
  pointer pBVar1;
  bool bVar2;
  rep rVar3;
  pointer plVar4;
  GlobalFederateId *pGVar5;
  long lVar6;
  long lVar7;
  BasicBrokerInfo *brkr;
  pointer pBVar8;
  ActionMessage png;
  ActionMessage local_e8;
  
  rVar3 = std::chrono::_V2::steady_clock::now();
  pBVar8 = (brk->mBrokers).dataStorage.
           super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pBVar1 = (brk->mBrokers).dataStorage.
           super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  bVar2 = false;
  do {
    if (pBVar8 == pBVar1) {
      if (bVar2) {
        ActionMessage::ActionMessage(&local_e8,cmd_broker_configure);
        local_e8.dest_id.gid = (brk->super_BrokerBase).global_id._M_i.gid;
        local_e8.source_id.gid = (brk->super_BrokerBase).global_id._M_i.gid;
        local_e8.messageID = 0x25f;
        local_e8.flags._0_1_ = (byte)local_e8.flags | 0x20;
        BrokerBase::addActionMessage(&brk->super_BrokerBase,&local_e8);
        ActionMessage::~ActionMessage(&local_e8);
      }
      return;
    }
    plVar4 = (this->connections).
             super__Vector_base<helics::linkConnection,_std::allocator<helics::linkConnection>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar7 = (long)(this->connections).
                  super__Vector_base<helics::linkConnection,_std::allocator<helics::linkConnection>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)plVar4;
    pGVar5 = &plVar4->connection;
    for (lVar6 = 0; lVar7 >> 4 != lVar6; lVar6 = lVar6 + 1) {
      if (pGVar5->gid == (pBVar8->global_id).gid) goto LAB_002a8d09;
      pGVar5 = pGVar5 + 4;
    }
    std::vector<helics::linkConnection,_std::allocator<helics::linkConnection>_>::emplace_back<>
              (&this->connections);
    plVar4 = (this->connections).
             super__Vector_base<helics::linkConnection,_std::allocator<helics::linkConnection>_>.
             _M_impl.super__Vector_impl_data._M_start;
    *(BaseType *)((long)plVar4 + lVar7 + 4) = (pBVar8->global_id).gid;
    *(bool *)((long)plVar4 + lVar7 + 2) = pBVar8->_disable_ping;
    lVar6 = lVar7 >> 4;
LAB_002a8d09:
    if (pBVar8->state < ERROR_STATE) {
      if (plVar4[lVar6].disablePing == false) {
        plVar4 = plVar4 + lVar6;
        plVar4->waitingForPingReply = true;
        plVar4->activeConnection = true;
        (plVar4->lastPing).__d.__r = rVar3;
        ActionMessage::ActionMessage(&local_e8,(uint)pBVar8->_core + cmd_broker_setup | cmd_ping);
        local_e8.source_id.gid = (brk->super_BrokerBase).global_broker_id_local.gid;
        local_e8.dest_id.gid = (pBVar8->global_id).gid;
        (*(brk->super_Broker)._vptr_Broker[0x22])(brk,(ulong)(uint)(pBVar8->route).rid,&local_e8);
        ActionMessage::~ActionMessage(&local_e8);
        bVar2 = true;
      }
    }
    else {
      plVar4[lVar6].activeConnection = false;
    }
    pBVar8 = pBVar8 + 1;
  } while( true );
}

Assistant:

void TimeoutMonitor::pingSub(CoreBroker* brk)
{
    auto now = std::chrono::steady_clock::now();
    bool activePing = false;
    for (const auto& brkr : brk->mBrokers) {
        size_t cindex = connections.size();
        for (size_t ii = 0; ii < cindex; ++ii) {
            if (connections[ii].connection == brkr.global_id) {
                cindex = ii;
                break;
            }
        }
        if (cindex == connections.size()) {
            connections.emplace_back();
            connections[cindex].connection = brkr.global_id;
            connections[cindex].disablePing = brkr._disable_ping;
        }

        if (brkr.state < ConnectionState::ERROR_STATE) {
            if (connections[cindex].disablePing) {
                continue;
            }
            connections[cindex].activeConnection = true;
            connections[cindex].waitingForPingReply = true;
            connections[cindex].lastPing = now;
            // send the ping
            ActionMessage png(brkr._core ? CMD_PING : CMD_BROKER_PING);
            png.source_id = brk->global_broker_id_local;
            png.dest_id = brkr.global_id;
            brk->transmit(brkr.route, png);
            activePing = true;
        } else {
            connections[cindex].activeConnection = false;
        }
    }
    if (activePing) {
        ActionMessage tickf(CMD_BROKER_CONFIGURE);
        tickf.dest_id = GlobalFederateId(brk->global_id);
        tickf.source_id = GlobalFederateId(brk->global_id);
        tickf.messageID = REQUEST_TICK_FORWARDING;
        setActionFlag(tickf, indicator_flag);
        brk->addActionMessage(tickf);
    }
}